

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O0

Expression *
slang::ast::IntegerLiteral::fromSyntax(Compilation *compilation,LiteralExpressionSyntax *syntax)

{
  Type *args_1;
  IntegerLiteral *pIVar1;
  SourceRange local_58;
  bool local_45 [13];
  Token local_38;
  undefined1 local_28 [8];
  SVInt val;
  LiteralExpressionSyntax *syntax_local;
  Compilation *compilation_local;
  
  val.super_SVIntStorage._8_8_ = syntax;
  if ((syntax->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.kind !=
      IntegerLiteralExpression) {
    assert::assertFailed
              ("syntax.kind == SyntaxKind::IntegerLiteralExpression",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/LiteralExpressions.cpp"
               ,0x25,
               "static Expression &slang::ast::IntegerLiteral::fromSyntax(Compilation &, const LiteralExpressionSyntax &)"
              );
  }
  parsing::Token::intValue(&local_38);
  SVInt::resize((SVInt *)local_28,(bitwidth_t)&local_38);
  SVInt::~SVInt((SVInt *)&local_38);
  SVInt::setSigned((SVInt *)local_28,true);
  args_1 = Compilation::getIntType(compilation);
  local_45[0] = true;
  local_58 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)val.super_SVIntStorage._8_8_);
  pIVar1 = BumpAllocator::
           emplace<slang::ast::IntegerLiteral,slang::ast::Compilation&,slang::ast::Type_const&,slang::SVInt,bool,slang::SourceRange>
                     (&compilation->super_BumpAllocator,compilation,args_1,(SVInt *)local_28,
                      local_45,&local_58);
  SVInt::~SVInt((SVInt *)local_28);
  return &pIVar1->super_Expression;
}

Assistant:

Expression& IntegerLiteral::fromSyntax(Compilation& compilation,
                                       const LiteralExpressionSyntax& syntax) {
    ASSERT(syntax.kind == SyntaxKind::IntegerLiteralExpression);

    SVInt val = syntax.literal.intValue().resize(32);
    val.setSigned(true);

    return *compilation.emplace<IntegerLiteral>(compilation, compilation.getIntType(),
                                                std::move(val), true, syntax.sourceRange());
}